

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O0

int main(void)

{
  int in_stack_00000034;
  
  type_test();
  sleep(3);
  stressing_single_thread();
  sleep(3);
  stressing_multi_threads(in_stack_00000034);
  sleep(3);
  return 0;
}

Assistant:

int main(){
    // 共500014行 
    type_test();
    sleep(3);

    stressing_single_thread();
    sleep(3);

    stressing_multi_threads();
    sleep(3);
        
    return 0;
}